

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall
HighsMipSolverData::callbackUserSolution
          (HighsMipSolverData *this,double mipsolver_objective_value,
          HighsInt user_solution_callback_origin)

{
  uint uVar1;
  HighsCallback *pHVar2;
  HighsMipSolver *this_00;
  HighsLp *lp;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double solobj;
  double *integrality_violation;
  vector<double,_std::allocator<double>_> user_solution;
  vector<double,_std::allocator<double>_> reduced_user_solution;
  double integrality_violation_;
  double row_violation_;
  double bound_violation_;
  HighsCDouble local_68;
  string local_58;
  _Vector_base<double,_std::allocator<double>_> local_38;
  
  setCallbackDataOut(this,mipsolver_objective_value);
  pHVar2 = this->mipsolver->callback_;
  (pHVar2->data_out).user_solution_callback_origin = user_solution_callback_origin;
  HighsCallback::clearHighsCallbackDataIn(pHVar2);
  pHVar2 = this->mipsolver->callback_;
  std::__cxx11::string::string((string *)&local_58,"MIP User solution",(allocator *)&user_solution);
  HighsCallback::callbackAction(pHVar2,9,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if ((this->mipsolver->callback_->data_in).user_solution != (double *)0x0) {
    std::vector<double,_std::allocator<double>_>::vector
              (&user_solution,(long)this->mipsolver->orig_model_->num_col_,
               (allocator_type *)&reduced_user_solution);
    this_00 = this->mipsolver;
    lp = this_00->orig_model_;
    uVar1 = lp->num_col_;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      user_solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (this_00->callback_->data_in).user_solution[uVar5];
    }
    bound_violation_ = 0.0;
    row_violation_ = 0.0;
    integrality_violation = &integrality_violation_;
    integrality_violation_ = 0.0;
    local_68.hi = 0.0;
    local_68.lo = 0.0;
    bVar3 = HighsMipSolver::solutionFeasible
                      (this_00,lp,&user_solution,(vector<double,_std::allocator<double>_> *)0x0,
                       &bound_violation_,&row_violation_,integrality_violation,&local_68);
    solobj = local_68.hi + local_68.lo;
    if (bVar3) {
      reduced_user_solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      reduced_user_solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      reduced_user_solution.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      presolve::HighsPostsolveStack::getReducedPrimalSolution
                ((vector<double,_std::allocator<double>_> *)&local_38,&this->postSolveStack,
                 &user_solution);
      std::vector<double,_std::allocator<double>_>::_M_move_assign(&reduced_user_solution,&local_38)
      ;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_38);
      addIncumbent(this,&reduced_user_solution,solobj,0xe,true,true);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&reduced_user_solution.super__Vector_base<double,_std::allocator<double>_>);
    }
    else {
      highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,kWarning,
                   "User-supplied solution has with objective %g has violations: bound = %.4g; integrality = %.4g; row = %.4g\n"
                   ,solobj,bound_violation_,integrality_violation_,row_violation_,
                   integrality_violation);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&user_solution.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void HighsMipSolverData::callbackUserSolution(
    const double mipsolver_objective_value,
    const HighsInt user_solution_callback_origin) {
  setCallbackDataOut(mipsolver_objective_value);
  mipsolver.callback_->data_out.user_solution_callback_origin =
      user_solution_callback_origin;

  mipsolver.callback_->clearHighsCallbackDataIn();
  const bool interrupt = mipsolver.callback_->callbackAction(
      kCallbackMipUserSolution, "MIP User solution");
  assert(!interrupt);
  if (mipsolver.callback_->data_in.user_solution) {
    std::vector<double> user_solution(mipsolver.orig_model_->num_col_);
    for (HighsInt iCol = 0; iCol < mipsolver.orig_model_->num_col_; iCol++)
      user_solution[iCol] = mipsolver.callback_->data_in.user_solution[iCol];
    double bound_violation_ = 0;
    double row_violation_ = 0;
    double integrality_violation_ = 0;
    HighsCDouble user_solution_quad_objective_value = 0;
    const bool feasible = mipsolver.solutionFeasible(
        mipsolver.orig_model_, user_solution, nullptr, bound_violation_,
        row_violation_, integrality_violation_,
        user_solution_quad_objective_value);
    double user_solution_objective_value =
        double(user_solution_quad_objective_value);
    if (!feasible) {
      highsLogUser(
          mipsolver.options_mip_->log_options, HighsLogType::kWarning,
          "User-supplied solution has with objective %g has violations: "
          "bound = %.4g; integrality = %.4g; row = %.4g\n",
          user_solution_objective_value, bound_violation_,
          integrality_violation_, row_violation_);
      return;
    }
    std::vector<double> reduced_user_solution;
    reduced_user_solution =
        postSolveStack.getReducedPrimalSolution(user_solution);
    const bool print_display_line = true;
    const bool is_user_solution = true;
    addIncumbent(reduced_user_solution, user_solution_objective_value,
                 kSolutionSourceUserSolution, print_display_line,
                 is_user_solution);
  }
}